

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O2

size_t __thiscall spvtools::opt::ValueTableHash::operator()(ValueTableHash *this,Instruction *inst)

{
  uint **ppuVar1;
  char32_t __c;
  uint32_t uVar2;
  Operand *pOVar3;
  uint **ppuVar4;
  char32_t *pcVar5;
  size_t sVar6;
  uint32_t i;
  uint32_t index;
  char32_t *pcVar7;
  u32string h;
  hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_49;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_48,inst->opcode_);
  __c = Instruction::type_id(inst);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_48,__c);
  index = 0;
  while( true ) {
    uVar2 = Instruction::NumInOperands(inst);
    if (uVar2 <= index) break;
    pOVar3 = Instruction::GetInOperand(inst,index);
    ppuVar1 = (uint **)(pOVar3->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar4 = &(pOVar3->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar4 = ppuVar1;
    }
    pcVar7 = (char32_t *)*ppuVar4;
    pcVar5 = (char32_t *)utils::SmallVector<unsigned_int,_2UL>::end(&pOVar3->words);
    for (; pcVar7 != pcVar5; pcVar7 = pcVar7 + 1) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_48,*pcVar7);
    }
    index = index + 1;
  }
  sVar6 = std::
          hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator()(&local_49,&local_48);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_dispose(&local_48);
  return sVar6;
}

Assistant:

std::size_t ValueTableHash::operator()(const Instruction& inst) const {
  // We hash the opcode and in-operands, not the result, because we want
  // instructions that are the same except for the result to hash to the
  // same value.
  std::u32string h;
  h.push_back(uint32_t(inst.opcode()));
  h.push_back(inst.type_id());
  for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
    const auto& opnd = inst.GetInOperand(i);
    for (uint32_t word : opnd.words) {
      h.push_back(word);
    }
  }
  return std::hash<std::u32string>()(h);
}